

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandReporter.cpp
# Opt level: O0

bool ApprovalTests::CommandReporter::exists(string *command)

{
  bool bVar1;
  int iVar2;
  char *__command;
  bool bVar3;
  string *in_stack_00000010;
  int result;
  string which;
  bool foundByWhich;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  
  bVar3 = false;
  bVar1 = SystemUtils::isWindowsOs();
  if (!bVar1) {
    __lhs = &local_50;
    ::std::operator+(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    ::std::operator+(__lhs,(char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    ::std::__cxx11::string::~string((string *)&local_50);
    __command = (char *)::std::__cxx11::string::c_str();
    iVar2 = system(__command);
    bVar3 = iVar2 == 0;
    ::std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  }
  bVar1 = true;
  if (!bVar3) {
    bVar1 = FileUtils::fileExists(in_stack_00000010);
  }
  return bVar1;
}

Assistant:

bool CommandReporter::exists(const std::string& command)
    {
        bool foundByWhich = false;
        if (!SystemUtils::isWindowsOs())
        {
            std::string which = "which " + command + " > /dev/null 2>&1";
            int result = system(which.c_str());
            foundByWhich = (result == 0);
        }
        return foundByWhich || FileUtils::fileExists(command);
    }